

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

char * SpellcheckStringV(string *text,vector<const_char_*,_std::allocator<const_char_*>_> *words)

{
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  StringPiece local_68;
  StringPiece local_58;
  int local_44;
  const_iterator cStack_40;
  int distance;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_38;
  const_iterator i;
  char *result;
  int min_distance;
  int kMaxValidEditDistance;
  bool kAllowReplacements;
  vector<const_char_*,_std::allocator<const_char_*>_> *words_local;
  string *text_local;
  
  result._4_4_ = 4;
  i._M_current = (char **)0x0;
  local_38._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(words);
  while( true ) {
    cStack_40 = std::vector<const_char_*,_std::allocator<const_char_*>_>::end(words);
    bVar1 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_38);
    StringPiece::StringPiece(&local_58,*ppcVar3);
    StringPiece::StringPiece(&local_68,text);
    iVar2 = EditDistance(&local_58,&local_68,true,3);
    local_44 = iVar2;
    if (iVar2 < result._4_4_) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&local_38);
      i._M_current = (char **)*ppcVar3;
      result._4_4_ = iVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_38);
  }
  return (char *)i._M_current;
}

Assistant:

const char* SpellcheckStringV(const string& text,
                              const vector<const char*>& words) {
  const bool kAllowReplacements = true;
  const int kMaxValidEditDistance = 3;

  int min_distance = kMaxValidEditDistance + 1;
  const char* result = NULL;
  for (vector<const char*>::const_iterator i = words.begin();
       i != words.end(); ++i) {
    int distance = EditDistance(*i, text, kAllowReplacements,
                                kMaxValidEditDistance);
    if (distance < min_distance) {
      min_distance = distance;
      result = *i;
    }
  }
  return result;
}